

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall
fixedMeasurement_methods_Test::~fixedMeasurement_methods_Test(fixedMeasurement_methods_Test *this)

{
  fixedMeasurement_methods_Test *this_local;
  
  ~fixedMeasurement_methods_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(fixedMeasurement, methods)
{
    fixed_measurement size(1.2, m);
    auto f2 = size.convert_to(in);
    EXPECT_TRUE(f2 == size);

    measurement m3(1.0, f2.as_unit());
    EXPECT_DOUBLE_EQ(m3.value(), 1.0);
    EXPECT_TRUE(m3 == f2);

    EXPECT_FLOAT_EQ(static_cast<float>(f2.value_as(m)), 1.2F);
    EXPECT_FLOAT_EQ(static_cast<float>(size.value_as(f2.as_unit())), 1.0F);

    size += 0.1;
    EXPECT_TRUE(size > f2);
    EXPECT_TRUE(size > m3);
    EXPECT_TRUE(f2 < size);
    EXPECT_TRUE(m3 < size);
    EXPECT_TRUE(size > 1.2);
    EXPECT_TRUE(1.2 < size);

    EXPECT_TRUE(size >= f2);
    EXPECT_TRUE(size >= m3);
    EXPECT_TRUE(f2 <= size);
    EXPECT_TRUE(m3 <= size);
    EXPECT_TRUE(size >= 1.2);
    EXPECT_TRUE(1.2 <= size);

    size -= 0.1;
    EXPECT_TRUE(size == f2);
    EXPECT_TRUE(size == m3);
    EXPECT_TRUE(f2 == size);
    EXPECT_TRUE(m3 == size);
    EXPECT_TRUE(size == 1.2);
    EXPECT_TRUE(1.2 == size);

    EXPECT_FALSE(size != 1.2);
    EXPECT_FALSE(1.2 != size);

    EXPECT_TRUE(size >= f2);
    EXPECT_TRUE(size >= m3);
    EXPECT_TRUE(f2 >= size);
    EXPECT_TRUE(m3 >= size);
    EXPECT_TRUE(size >= 1.2);
    EXPECT_TRUE(1.2 >= size);

    EXPECT_TRUE(size <= f2);
    EXPECT_TRUE(size <= m3);
    EXPECT_TRUE(f2 <= size);
    EXPECT_TRUE(m3 <= size);
    EXPECT_TRUE(size <= 1.2);
    EXPECT_TRUE(1.2 <= size);

    EXPECT_TRUE(is_valid(size));
}